

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O1

bool __thiscall
Lib::
FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:267:17),_false>
::hasNext(FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:267:17),_false>
          *this)

{
  AnyNumber<Kernel::MonomFactor> *pAVar1;
  bool bVar2;
  anon_class_16_2_f84bbffd f;
  anon_class_16_2_f84bbffd f_00;
  anon_class_16_2_f84bbffd f_01;
  _ElementType next;
  OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> local_a8;
  undefined1 local_78 [8];
  char acStack_70 [17];
  int iStack_5f;
  undefined3 uStack_5b;
  ulong local_58 [5];
  
  bVar2 = true;
  if ((this->_next).super_OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>._isSome == false)
  {
    pAVar1 = (this->_inn)._inner._pointer;
    if (pAVar1 != ((this->_inn)._inner._stack)->_stack) {
      do {
        (this->_inn)._inner._pointer = pAVar1 + -1;
        local_a8._elem._elem._12_8_ = 0;
        local_a8._elem._elem._20_8_ = 0;
        local_a8._elem._elem._4_8_ = 0;
        local_a8._0_8_ =
             (ulong)*(byte *)&pAVar1[-1].
                              super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                              ._inner.
                              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                              .
                              super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             & 0xffffffffffffff03;
        f.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                   *)(pAVar1 + -1);
        f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                  *)&local_a8;
        CoproductImpl::
        RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
        ::
        switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>>const&)::_lambda(auto:1)_1_>
                  ((RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
                    *)&local_a8,f);
        acStack_70[0] = '\0';
        acStack_70[1] = '\0';
        acStack_70[2] = '\0';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        acStack_70[8] = '\0';
        acStack_70[9] = '\0';
        acStack_70[10] = '\0';
        acStack_70[0xb] = '\0';
        acStack_70[0xc] = '\0';
        acStack_70[0xd] = '\0';
        acStack_70[0xe] = '\0';
        acStack_70[0xf] = '\0';
        acStack_70[0x10] = '\0';
        iStack_5f._0_1_ = '\0';
        iStack_5f._1_1_ = '\0';
        iStack_5f._2_1_ = '\0';
        iStack_5f._3_1_ = '\0';
        uStack_5b = 0;
        local_78 = (undefined1  [8])(local_a8._0_8_ & 3);
        f_00.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      *)&local_a8;
        f_00.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                     *)local_78;
        CoproductImpl::
        RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
        ::
        switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>&&)::_lambda(auto:1)_1_>
                  ((RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
                    *)local_78,f_00);
        if (iStack_5f == 1) {
          Kernel::PolyNf::tryVar((PolyNf *)(local_78 + 1));
        }
        else {
          local_a8._0_8_ = 0;
        }
        if (local_a8._isSome == true) {
          local_58[1] = 0;
          local_58[2] = 0;
          local_58[3] = 0;
          local_58[0] = (ulong)local_78 & 3;
          f_01.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                        *)local_78;
          f_01.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       *)local_58;
          CoproductImpl::
          RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
          ::
          switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>&&)::_lambda(auto:1)_1_>
                    ((RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
                      *)local_58,f_01);
          OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>::OptionBase
                    (&local_a8,(AnyNumber<Kernel::MonomFactor> *)local_58);
          OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>::operator=
                    (&(this->_next).super_OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>,
                     &local_a8);
          return true;
        }
        pAVar1 = (this->_inn)._inner._pointer;
      } while (pAVar1 != ((this->_inn)._inner._stack)->_stack);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool hasNext()
  {
    if(_next.isSome()) {
      return true;
    }
    while(_inn.hasNext()) {
      OWN_ELEMENT_TYPE next = move_if_value<OWN_ELEMENT_TYPE>(_inn.next());
      if(_func(next)) {
        _next = Option<OWN_ELEMENT_TYPE>(move_if_value<OWN_ELEMENT_TYPE>(next));
        return true;
      } else {
        __doDeletion<deleteFilteredOut>{}(_inn);
      }
    }
    return false;
  }